

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorList.c
# Opt level: O1

void NewRangeInsertCubePair(cubedist Dist,Cube *p1,Cube *p2)

{
  int iVar1;
  
  iVar1 = s_Que[Dist].PosCur;
  if ((s_Que[Dist].fEmpty == 0) && (iVar1 == s_Que[Dist].PosOut)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorList.c"
                  ,0x3d5,"void NewRangeInsertCubePair(cubedist, Cube *, Cube *)");
  }
  s_Que[Dist].pC1[iVar1] = p1;
  s_Que[Dist].pC2[iVar1] = p2;
  s_Que[Dist].ID1[iVar1] = p1->ID;
  s_Que[Dist].ID2[iVar1] = p2->ID;
  s_Que[Dist].PosCur = (s_Que[Dist].PosCur + 1) % s_nPosAlloc;
  return;
}

Assistant:

void NewRangeInsertCubePair( cubedist Dist, Cube* p1, Cube* p2 )
// insert one cube pair into the new range
{
    que* p = &s_Que[Dist];
    int Pos = p->PosCur;

    if ( p->fEmpty || Pos != p->PosOut )
    {
        p->pC1[Pos] = p1;
        p->pC2[Pos] = p2;
        p->ID1[Pos] = p1->ID;
        p->ID2[Pos] = p2->ID;

        p->PosCur = (p->PosCur+1)%s_nPosAlloc;
    }
    else
        assert(0);
//      cout << endl << "DIST-" << (int)(Dist+2) << ": Have run out of queque space!" << endl;
}